

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

FFSTypeHandle_conflict FFSnext_type_handle(FFSFile ffsfile)

{
  int iVar1;
  long in_RDI;
  FFSContext in_stack_00000010;
  FFSFile in_stack_000000a8;
  FFSFile in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0xb0) == 0) {
    if (*(int *)(in_RDI + 0x48) == 0) {
      next_record_type(in_stack_000000a8);
    }
    do {
      if (*(int *)(in_RDI + 0x54) == 4) {
        if (*(int *)(*(long *)(in_RDI + 0x60) + 0x28) == 0) {
          FFS_determine_conversion(in_stack_00000010,(FFSTypeHandle_conflict)ffsfile);
          *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(*(long *)(in_RDI + 0x60) + 0x30);
        }
        return *(FFSTypeHandle_conflict *)(in_RDI + 0x58);
      }
      iVar1 = FFSconsume_next_item(in_stack_ffffffffffffffe8);
    } while (iVar1 != 0);
  }
  return (FFSTypeHandle_conflict)0x0;
}

Assistant:

extern
FFSTypeHandle
FFSnext_type_handle(FFSFile ffsfile)
{
    if (ffsfile->status != OpenForRead)
	return NULL;

    if (ffsfile->read_ahead == FALSE) {
	(void) next_record_type(ffsfile);
    }
    while (ffsfile->next_record_type != FFSdata) {
	if (!FFSconsume_next_item(ffsfile)) return NULL;
    }
    if (ffsfile->next_actual_handle->status == not_checked) {
	FFS_determine_conversion(ffsfile->c, ffsfile->next_actual_handle);
	ffsfile->next_data_handle = ffsfile->next_actual_handle->conversion_target;
    }
    return ffsfile->next_data_handle;
}